

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int cm_zlib_deflateEnd(z_streamp strm)

{
  int iVar1;
  int iVar2;
  internal_state *piVar3;
  
  iVar1 = deflateStateCheck(strm);
  iVar2 = -2;
  if (iVar1 == 0) {
    piVar3 = strm->state;
    iVar1 = piVar3->status;
    if (piVar3->pending_buf != (Bytef *)0x0) {
      (*strm->zfree)(strm->opaque,piVar3->pending_buf);
      piVar3 = strm->state;
    }
    if (piVar3->head != (Posf *)0x0) {
      (*strm->zfree)(strm->opaque,piVar3->head);
      piVar3 = strm->state;
    }
    if (piVar3->prev != (Posf *)0x0) {
      (*strm->zfree)(strm->opaque,piVar3->prev);
      piVar3 = strm->state;
    }
    if (piVar3->window != (Bytef *)0x0) {
      (*strm->zfree)(strm->opaque,piVar3->window);
      piVar3 = strm->state;
    }
    (*strm->zfree)(strm->opaque,piVar3);
    strm->state = (internal_state *)0x0;
    iVar2 = (uint)(iVar1 != 0x71) * 3 + -3;
  }
  return iVar2;
}

Assistant:

int ZEXPORT deflateEnd (strm)
    z_streamp strm;
{
    int status;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;

    status = strm->state->status;

    /* Deallocate in reverse order of allocations: */
    TRY_FREE(strm, strm->state->pending_buf);
    TRY_FREE(strm, strm->state->head);
    TRY_FREE(strm, strm->state->prev);
    TRY_FREE(strm, strm->state->window);

    ZFREE(strm, strm->state);
    strm->state = Z_NULL;

    return status == BUSY_STATE ? Z_DATA_ERROR : Z_OK;
}